

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

bool __thiscall QMainWindowLayout::plug(QMainWindowLayout *this,QLayoutItem *widgetItem)

{
  bool bVar1;
  QWidgetAnimator *this_00;
  QDockWidgetGroupWindow **ppQVar2;
  QDockWidgetGroupWindow *pQVar3;
  QWidget *pQVar4;
  undefined8 uVar5;
  QMainWindowLayoutState *this_01;
  QDockAreaLayoutInfo *pQVar6;
  QLayoutItem *pQVar7;
  QDockWidgetLayout *this_02;
  QDockWidget *pQVar8;
  QStyle *pQVar9;
  QList<int> *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int fw;
  QDockWidgetLayout *layout;
  QLayoutItem *it;
  QDockWidgetGroupWindow *dwgw_1;
  QList<QDockWidgetGroupWindow_*> *__range1;
  QWidget *widget;
  QList<QDockWidgetGroupWindow_*> *__range2;
  QWidget *widget_1;
  QRect globalRect;
  QList<int> previousPath;
  QList<int> path_1;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QDockWidgetGroupWindow_*> groups;
  QRect globalRect_1;
  QList<int> path;
  QDockWidgetGroupWindow *dwgw;
  const_iterator __end2;
  const_iterator __begin2;
  QList<QDockWidgetGroupWindow_*> groups_1;
  QList<int> previousPath_1;
  undefined4 in_stack_fffffffffffffdf8;
  FindChildOption in_stack_fffffffffffffdfc;
  QRect *in_stack_fffffffffffffe00;
  QDockWidgetGroupWindow *in_stack_fffffffffffffe08;
  QWidget *in_stack_fffffffffffffe10;
  QList<int> *path_00;
  QWidget *in_stack_fffffffffffffe28;
  QMainWindowLayoutState *in_stack_fffffffffffffe30;
  QDockAreaLayoutInfo *in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe80;
  undefined1 uVar10;
  QRect *in_stack_fffffffffffffe88;
  QRect *_final_geometry;
  QWidgetAnimator *in_stack_fffffffffffffe90;
  bool local_155;
  QFlagsStorageHelper<QMainWindow::DockOption,_4> local_154;
  QPoint local_150;
  QPoint local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  QDockWidgetGroupWindow **local_100;
  const_iterator local_f8;
  const_iterator local_f0 [2];
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  QFlagsStorageHelper<QMainWindow::DockOption,_4> local_c4;
  QPoint local_c0;
  QPoint local_b8;
  undefined1 *local_b0;
  QWidget *in_stack_ffffffffffffff58;
  undefined8 local_a0;
  undefined8 local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  QDockWidgetGroupWindow *local_78;
  QDockWidgetGroupWindow **local_70;
  const_iterator local_68;
  const_iterator local_60 [2];
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QDockWidgetGroupWindow> *)0x5fa215);
  if (bVar1) {
    this_00 = (QWidgetAnimator *)(*(code *)(in_RSI->d).d[6].super_QArrayData.alloc)();
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QMainWindowLayoutState::indexOf(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    bVar1 = QList<int>::isEmpty((QList<int> *)0x5fa28f);
    if (!bVar1) {
      QMainWindowLayoutState::remove((QMainWindowLayoutState *)(in_RDI + 0x88),(char *)&local_20);
    }
    QPointer<QDockWidgetGroupWindow>::operator->((QPointer<QDockWidgetGroupWindow> *)0x5fa2bd);
    QDockWidgetGroupWindow::layoutInfo((QDockWidgetGroupWindow *)0x5fa2c5);
    QDockAreaLayoutInfo::indexOf(in_stack_fffffffffffffe38,(QWidget *)in_stack_fffffffffffffe30);
    QList<int>::operator=
              ((QList<int> *)in_stack_fffffffffffffe00,
               (QList<int> *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    QList<int>::~QList((QList<int> *)0x5fa2ff);
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    QObject::parent((QObject *)0x5fa336);
    QFlags<Qt::FindChildOption>::QFlags
              ((QFlags<Qt::FindChildOption> *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
    QObject::findChildren<QDockWidgetGroupWindow*>
              (&in_stack_fffffffffffffe10->super_QObject,
               (QFlagsStorageHelper<Qt::FindChildOption,_4>)
               SUB84((ulong)in_stack_fffffffffffffe38 >> 0x20,0));
    _final_geometry = (QRect *)&local_50;
    local_60[0].i = (QDockWidgetGroupWindow **)&DAT_aaaaaaaaaaaaaaaa;
    local_60[0] = QList<QDockWidgetGroupWindow_*>::begin
                            ((QList<QDockWidgetGroupWindow_*> *)in_stack_fffffffffffffe00);
    local_68.i = (QDockWidgetGroupWindow **)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = QList<QDockWidgetGroupWindow_*>::end
                         ((QList<QDockWidgetGroupWindow_*> *)in_stack_fffffffffffffe00);
    while( true ) {
      local_70 = local_68.i;
      bVar1 = QList<QDockWidgetGroupWindow_*>::const_iterator::operator!=(local_60,local_68);
      uVar10 = (undefined1)((ulong)in_stack_fffffffffffffe80 >> 0x38);
      if (!bVar1) break;
      ppQVar2 = QList<QDockWidgetGroupWindow_*>::const_iterator::operator*(local_60);
      local_78 = *ppQVar2;
      bVar1 = ::operator==((QDockWidgetGroupWindow **)in_stack_fffffffffffffe00,
                           (QPointer<QDockWidgetGroupWindow> *)
                           CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      if (!bVar1) {
        local_90 = &DAT_aaaaaaaaaaaaaaaa;
        local_88 = &DAT_aaaaaaaaaaaaaaaa;
        local_80 = &DAT_aaaaaaaaaaaaaaaa;
        QDockWidgetGroupWindow::layoutInfo((QDockWidgetGroupWindow *)0x5fa471);
        QDockAreaLayoutInfo::indexOf(in_stack_fffffffffffffe38,(QWidget *)in_stack_fffffffffffffe30)
        ;
        bVar1 = QList<int>::isEmpty((QList<int> *)0x5fa496);
        if (!bVar1) {
          pQVar6 = QDockWidgetGroupWindow::layoutInfo((QDockWidgetGroupWindow *)0x5fa4a7);
          QDockAreaLayoutInfo::remove(pQVar6,(char *)&local_90);
        }
        QList<int>::~QList((QList<int> *)0x5fa4c4);
      }
      QList<QDockWidgetGroupWindow_*>::const_iterator::operator++(local_60);
    }
    QRect::QRect(in_stack_fffffffffffffe00);
    *(undefined8 *)(in_RDI + 0x7c8) = local_a0;
    *(undefined8 *)(in_RDI + 2000) = local_98;
    QPointer<QDockWidgetGroupWindow>::operator->((QPointer<QDockWidgetGroupWindow> *)0x5fa512);
    QDockWidgetGroupWindow::apply(in_stack_fffffffffffffe08);
    bVar1 = QList<int>::isEmpty((QList<int> *)0x5fa527);
    if (!bVar1) {
      QPointer<QDockWidgetGroupWindow>::operator->((QPointer<QDockWidgetGroupWindow> *)0x5fa53c);
      pQVar6 = QDockWidgetGroupWindow::layoutInfo((QDockWidgetGroupWindow *)0x5fa544);
      QDockAreaLayoutInfo::remove(pQVar6,(char *)&local_20);
    }
    local_b0 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar3 = QPointer<QDockWidgetGroupWindow>::operator->
                       ((QPointer<QDockWidgetGroupWindow> *)0x5fa583);
    local_b0._0_4_ = (pQVar3->currentGapRect).x1;
    local_b0._4_4_ = (pQVar3->currentGapRect).y1;
    pQVar4 = *(QWidget **)&(pQVar3->currentGapRect).x2;
    QPointer<QDockWidgetGroupWindow>::operator->((QPointer<QDockWidgetGroupWindow> *)0x5fa5ac);
    local_c0 = QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8)
                             );
    local_b8 = QWidget::mapToGlobal(in_stack_fffffffffffffe10,(QPoint *)in_stack_fffffffffffffe08);
    QRect::moveTopLeft(in_stack_fffffffffffffe00,
                       (QPoint *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    *(QWidgetAnimator **)(in_RDI + 0x7d8) = this_00;
    local_c4.super_QFlagsStorage<QMainWindow::DockOption>.i =
         (QFlagsStorage<QMainWindow::DockOption>)
         QFlags<QMainWindow::DockOption>::operator&
                   ((QFlags<QMainWindow::DockOption> *)in_stack_fffffffffffffe00,
                    in_stack_fffffffffffffdfc);
    ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c4);
    QWidgetAnimator::animate(this_00,pQVar4,_final_geometry,(bool)uVar10);
    local_155 = true;
    QList<QDockWidgetGroupWindow_*>::~QList((QList<QDockWidgetGroupWindow_*> *)0x5fa681);
    QList<int>::~QList((QList<int> *)0x5fa68e);
  }
  else {
    QLayout::parentWidget((QLayout *)in_stack_fffffffffffffe10);
    bVar1 = QWidget::isVisible((QWidget *)0x5fa6a5);
    if (bVar1) {
      pQVar4 = QLayout::parentWidget((QLayout *)in_stack_fffffffffffffe10);
      bVar1 = QWidget::isMinimized(pQVar4);
      if ((!bVar1) && (bVar1 = QList<int>::isEmpty((QList<int> *)0x5fa6d2), !bVar1)) {
        path_00 = in_RSI;
        QList<int>::at((QList<int> *)in_stack_fffffffffffffe00,
                       CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        fixToolBarOrientation
                  ((QLayoutItem *)in_stack_fffffffffffffe10,
                   (int)((ulong)in_stack_fffffffffffffe08 >> 0x20));
        uVar5 = (*(code *)(in_RSI->d).d[6].super_QArrayData.alloc)();
        local_e0 = &DAT_aaaaaaaaaaaaaaaa;
        local_d8 = &DAT_aaaaaaaaaaaaaaaa;
        local_d0 = &DAT_aaaaaaaaaaaaaaaa;
        this_01 = (QMainWindowLayoutState *)QObject::parent((QObject *)0x5fa761);
        QFlags<Qt::FindChildOption>::QFlags
                  ((QFlags<Qt::FindChildOption> *)in_stack_fffffffffffffe00,
                   in_stack_fffffffffffffdfc);
        QObject::findChildren<QDockWidgetGroupWindow*>
                  (&in_stack_fffffffffffffe10->super_QObject,
                   (QFlagsStorageHelper<Qt::FindChildOption,_4>)
                   SUB84((ulong)in_stack_fffffffffffffe38 >> 0x20,0));
        local_f0[0].i = (QDockWidgetGroupWindow **)&DAT_aaaaaaaaaaaaaaaa;
        local_f0[0] = QList<QDockWidgetGroupWindow_*>::begin
                                ((QList<QDockWidgetGroupWindow_*> *)in_stack_fffffffffffffe00);
        local_f8.i = (QDockWidgetGroupWindow **)&DAT_aaaaaaaaaaaaaaaa;
        local_f8 = QList<QDockWidgetGroupWindow_*>::end
                             ((QList<QDockWidgetGroupWindow_*> *)in_stack_fffffffffffffe00);
        while( true ) {
          local_100 = local_f8.i;
          bVar1 = QList<QDockWidgetGroupWindow_*>::const_iterator::operator!=(local_f0,local_f8);
          if (!bVar1) break;
          QList<QDockWidgetGroupWindow_*>::const_iterator::operator*(local_f0);
          local_118 = &DAT_aaaaaaaaaaaaaaaa;
          local_110 = &DAT_aaaaaaaaaaaaaaaa;
          local_108 = &DAT_aaaaaaaaaaaaaaaa;
          QDockWidgetGroupWindow::layoutInfo((QDockWidgetGroupWindow *)0x5fa872);
          QDockAreaLayoutInfo::indexOf
                    (in_stack_fffffffffffffe38,(QWidget *)in_stack_fffffffffffffe30);
          bVar1 = QList<int>::isEmpty((QList<int> *)0x5fa897);
          if (!bVar1) {
            pQVar6 = QDockWidgetGroupWindow::layoutInfo((QDockWidgetGroupWindow *)0x5fa8a5);
            QDockAreaLayoutInfo::remove(pQVar6,(char *)&local_118);
          }
          QList<int>::~QList((QList<int> *)0x5fa8c2);
          QList<QDockWidgetGroupWindow_*>::const_iterator::operator++(local_f0);
        }
        local_130 = &DAT_aaaaaaaaaaaaaaaa;
        local_128 = &DAT_aaaaaaaaaaaaaaaa;
        local_120 = &DAT_aaaaaaaaaaaaaaaa;
        QMainWindowLayoutState::indexOf(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
        pQVar7 = QMainWindowLayoutState::plug(this_01,path_00);
        if (pQVar7 == (QLayoutItem *)0x0) {
          local_155 = false;
        }
        else {
          bVar1 = QList<int>::isEmpty((QList<int> *)0x5fa96c);
          if (!bVar1) {
            QMainWindowLayoutState::remove
                      ((QMainWindowLayoutState *)(in_RDI + 0x88),(char *)&local_130);
          }
          *(undefined8 *)(in_RDI + 0x7d8) = uVar5;
          local_140 = *(undefined8 *)(in_RDI + 0x7c8);
          local_138 = *(undefined8 *)(in_RDI + 2000);
          this_02 = (QDockWidgetLayout *)QLayout::parentWidget((QLayout *)in_stack_fffffffffffffe10)
          ;
          local_150 = QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffffdfc,
                                                       in_stack_fffffffffffffdf8));
          local_148 = QWidget::mapToGlobal((QWidget *)this_02,(QPoint *)in_stack_fffffffffffffe08);
          QRect::moveTopLeft(in_stack_fffffffffffffe00,
                             (QPoint *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8)
                            );
          pQVar8 = qobject_cast<QDockWidget*>((QObject *)0x5faa34);
          if (pQVar8 != (QDockWidget *)0x0) {
            QWidget::layout((QWidget *)0x5faa4b);
            qobject_cast<QDockWidgetLayout*>((QObject *)0x5faa53);
            bVar1 = QDockWidgetLayout::nativeWindowDeco(this_02);
            if (bVar1) {
              QDockWidgetLayout::titleHeight((QDockWidgetLayout *)in_stack_fffffffffffffe30);
              QRect::adjust((QRect *)this_02,(int)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                            (int)in_stack_fffffffffffffe08,
                            (int)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                            (int)in_stack_fffffffffffffe00);
            }
            else {
              pQVar9 = QWidget::style((QWidget *)
                                      CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8))
              ;
              (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x12,0,uVar5);
              QRect::adjust((QRect *)this_02,(int)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                            (int)in_stack_fffffffffffffe08,
                            (int)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                            (int)in_stack_fffffffffffffe00);
            }
          }
          uVar10 = (undefined1)((ulong)uVar5 >> 0x38);
          local_154.super_QFlagsStorage<QMainWindow::DockOption>.i =
               (QFlagsStorage<QMainWindow::DockOption>)
               QFlags<QMainWindow::DockOption>::operator&
                         ((QFlags<QMainWindow::DockOption> *)(in_RDI + 0x790),
                          in_stack_fffffffffffffdfc);
          ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_154);
          QWidgetAnimator::animate
                    (in_stack_fffffffffffffe90,in_stack_ffffffffffffff58,in_stack_fffffffffffffe88,
                     (bool)uVar10);
          local_155 = true;
        }
        QList<int>::~QList((QList<int> *)0x5fab61);
        QList<QDockWidgetGroupWindow_*>::~QList((QList<QDockWidgetGroupWindow_*> *)0x5fab6e);
        goto LAB_005fab6e;
      }
    }
    local_155 = false;
  }
LAB_005fab6e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_155;
}

Assistant:

bool QMainWindowLayout::plug(QLayoutItem *widgetItem)
{
#if QT_CONFIG(dockwidget) && QT_CONFIG(tabwidget) && QT_CONFIG(tabbar)
    if (currentHoveredFloat) {
        QWidget *widget = widgetItem->widget();
        QList<int> previousPath = layoutState.indexOf(widget);
        if (!previousPath.isEmpty())
            layoutState.remove(previousPath);
        previousPath = currentHoveredFloat->layoutInfo()->indexOf(widget);
        // Let's remove the widget from any possible group window
        const auto groups =
                parent()->findChildren<QDockWidgetGroupWindow*>(Qt::FindDirectChildrenOnly);
        for (QDockWidgetGroupWindow *dwgw : groups) {
            if (dwgw == currentHoveredFloat)
                continue;
            QList<int> path = dwgw->layoutInfo()->indexOf(widget);
            if (!path.isEmpty())
                dwgw->layoutInfo()->remove(path);
        }
        currentGapRect = QRect();
        currentHoveredFloat->apply();
        if (!previousPath.isEmpty())
            currentHoveredFloat->layoutInfo()->remove(previousPath);
        QRect globalRect = currentHoveredFloat->currentGapRect;
        globalRect.moveTopLeft(currentHoveredFloat->mapToGlobal(globalRect.topLeft()));
        pluggingWidget = widget;
        widgetAnimator.animate(widget, globalRect, dockOptions & QMainWindow::AnimatedDocks);
        return true;
    }
#endif

    if (!parentWidget()->isVisible() || parentWidget()->isMinimized() || currentGapPos.isEmpty())
        return false;

    fixToolBarOrientation(widgetItem, currentGapPos.at(1));

    QWidget *widget = widgetItem->widget();

#if QT_CONFIG(dockwidget)
    // Let's remove the widget from any possible group window
    const auto groups =
            parent()->findChildren<QDockWidgetGroupWindow*>(Qt::FindDirectChildrenOnly);
    for (QDockWidgetGroupWindow *dwgw : groups) {
        QList<int> path = dwgw->layoutInfo()->indexOf(widget);
        if (!path.isEmpty())
            dwgw->layoutInfo()->remove(path);
    }
#endif

    QList<int> previousPath = layoutState.indexOf(widget);

    const QLayoutItem *it = layoutState.plug(currentGapPos);
    if (!it)
        return false;
    Q_ASSERT(it == widgetItem);
    if (!previousPath.isEmpty())
        layoutState.remove(previousPath);

    pluggingWidget = widget;
    QRect globalRect = currentGapRect;
    globalRect.moveTopLeft(parentWidget()->mapToGlobal(globalRect.topLeft()));
#if QT_CONFIG(dockwidget)
    if (qobject_cast<QDockWidget*>(widget) != nullptr) {
        QDockWidgetLayout *layout = qobject_cast<QDockWidgetLayout*>(widget->layout());
        if (layout->nativeWindowDeco()) {
            globalRect.adjust(0, layout->titleHeight(), 0, 0);
        } else {
            int fw = widget->style()->pixelMetric(QStyle::PM_DockWidgetFrameWidth, nullptr, widget);
            globalRect.adjust(-fw, -fw, fw, fw);
        }
    }
#endif
    widgetAnimator.animate(widget, globalRect, dockOptions & QMainWindow::AnimatedDocks);

    return true;
}